

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::CloseButton(ImGuiID id,ImVec2 *pos,float radius)

{
  ImGuiWindow *pIVar1;
  ImDrawList *this;
  bool bVar2;
  bool bVar3;
  ImU32 IVar4;
  bool held;
  bool hovered;
  ImVec2 center;
  ImRect bb;
  bool local_6a;
  bool local_69;
  ImVec2 local_68;
  float local_5c;
  float local_58;
  ImRect local_48;
  ImVec2 local_38;
  ImVec2 local_30;
  
  pIVar1 = GImGui->CurrentWindow;
  local_48.Min.x = pos->x - radius;
  local_48.Min.y = pos->y - radius;
  local_48.Max.x = pos->x + radius;
  local_48.Max.y = pos->y + radius;
  local_58 = radius;
  bVar2 = ItemAdd(&local_48,id,(ImRect *)0x0);
  bVar3 = ButtonBehavior(&local_48,id,&local_69,&local_6a,0);
  if (bVar2) {
    local_68.x = (local_48.Min.x + local_48.Max.x) * 0.5;
    local_68.y = (local_48.Min.y + local_48.Max.y) * 0.5;
    if (local_69 == true) {
      this = pIVar1->DrawList;
      local_5c = 2.0;
      if (2.0 <= local_58) {
        local_5c = local_58;
      }
      IVar4 = GetColorU32(local_6a | 0x16,1.0);
      ImDrawList::AddCircleFilled(this,&local_68,local_5c,IVar4,9);
    }
    local_58 = local_58 * 0.7071 + -1.0;
    IVar4 = GetColorU32(0,1.0);
    local_68.x = local_68.x + -0.5;
    local_68.y = local_68.y + -0.5;
    local_30.y = local_58 + local_68.y;
    local_30.x = local_58 + local_68.x;
    local_38.y = local_68.y - local_58;
    local_38.x = local_68.x - local_58;
    ImDrawList::AddLine(pIVar1->DrawList,&local_30,&local_38,IVar4,1.0);
    local_30.y = local_68.y - local_58;
    local_30.x = local_58 + local_68.x;
    local_38.y = local_58 + local_68.y;
    local_38.x = local_68.x - local_58;
    ImDrawList::AddLine(pIVar1->DrawList,&local_30,&local_38,IVar4,1.0);
  }
  return bVar3;
}

Assistant:

bool ImGui::CloseButton(ImGuiID id, const ImVec2& pos, float radius)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // We intentionally allow interaction when clipped so that a mechanical Alt,Right,Validate sequence close a window.
    // (this isn't the regular behavior of buttons, but it doesn't affect the user much because navigation tends to keep items visible).
    const ImRect bb(pos - ImVec2(radius,radius), pos + ImVec2(radius,radius));
    bool is_clipped = !ItemAdd(bb, id);

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);
    if (is_clipped)
        return pressed;

    // Render
    ImVec2 center = bb.GetCenter();
    if (hovered)
        window->DrawList->AddCircleFilled(center, ImMax(2.0f, radius), GetColorU32(held ? ImGuiCol_ButtonActive : ImGuiCol_ButtonHovered), 9);

    float cross_extent = (radius * 0.7071f) - 1.0f;
    ImU32 cross_col = GetColorU32(ImGuiCol_Text);
    center -= ImVec2(0.5f, 0.5f);
    window->DrawList->AddLine(center + ImVec2(+cross_extent,+cross_extent), center + ImVec2(-cross_extent,-cross_extent), cross_col, 1.0f);
    window->DrawList->AddLine(center + ImVec2(+cross_extent,-cross_extent), center + ImVec2(-cross_extent,+cross_extent), cross_col, 1.0f);

    return pressed;
}